

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O0

IntervalMap<unsigned_long,_std::monostate,_0U> * __thiscall
slang::IntervalMap<unsigned_long,_std::monostate,_0U>::operator=
          (IntervalMap<unsigned_long,_std::monostate,_0U> *this,
          IntervalMap<unsigned_long,_std::monostate,_0U> *other)

{
  bool bVar1;
  uint uVar2;
  IntervalMap<unsigned_long,_std::monostate,_0U> *in_RSI;
  IntervalMap<unsigned_long,_std::monostate,_0U> *in_RDI;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  
  isFlat(in_RDI);
  in_RDI->height = in_RSI->height;
  uVar2 = std::exchange<unsigned_int,int>
                    ((uint *)in_RDI,
                     (int *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  in_RDI->rootSize = uVar2;
  bVar1 = isFlat(in_RSI);
  if (bVar1) {
    memcpy(in_RDI,in_RSI,0xc0);
  }
  else {
    memcpy(in_RDI,in_RSI,0xc0);
    in_RSI->height = 0;
    memset(in_RSI,0,0xc0);
  }
  return in_RDI;
}

Assistant:

IntervalMap& operator=(IntervalMap&& other) noexcept {
        if (isFlat())
            rootLeaf.~RootLeaf();
        else
            rootBranch.~RootBranch();

        height = other.height;
        rootSize = std::exchange(other.rootSize, 0);

        if (other.isFlat()) {
            rootLeaf = std::move(other.rootLeaf);
        }
        else {
            rootBranch = std::move(other.rootBranch);
            other.rootBranch.~RootBranch();
            other.height = 0;
            new (&other.rootLeaf) RootLeaf();
        }

        return *this;
    }